

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfdec.c
# Opt level: O1

int file_is_ivf(AvxInputContext *input_ctx)

{
  size_t sVar1;
  int iVar2;
  uchar raw_hdr [32];
  int local_38;
  short local_34;
  uint32_t local_30;
  ushort local_2c;
  ushort local_2a;
  int local_28;
  int local_24;
  
  sVar1 = buffer_input(input_ctx,0x20,(uchar *)&local_38,true);
  iVar2 = 0;
  if (local_38 == 0x46494b44 && sVar1 == 0x20) {
    if (local_34 != 0) {
      file_is_ivf_cold_1();
    }
    input_ctx->fourcc = local_30;
    input_ctx->width = (uint)local_2c;
    input_ctx->height = (uint)local_2a;
    (input_ctx->framerate).numerator = local_28;
    (input_ctx->framerate).denominator = local_24;
    iVar2 = 1;
    if ((local_24 + 0xc4653600U < 0xc4653601) || (local_28 - 1000U < 0xfffffc19)) {
      (input_ctx->framerate).numerator = 0x1e;
      (input_ctx->framerate).denominator = 1;
    }
  }
  if (local_38 != 0x46494b44 || sVar1 != 0x20) {
    rewind_detect(input_ctx);
  }
  return iVar2;
}

Assistant:

int file_is_ivf(struct AvxInputContext *input_ctx) {
  unsigned char raw_hdr[32];
  int is_ivf = 0;

  if (buffer_input(input_ctx, 32, raw_hdr, /*buffered=*/true) == 32) {
    if (memcmp(IVF_SIGNATURE, raw_hdr, 4) == 0) {
      is_ivf = 1;

      if (mem_get_le16(raw_hdr + 4) != 0) {
        fprintf(stderr,
                "Error: Unrecognized IVF version! This file may not"
                " decode properly.\n");
      }

      input_ctx->fourcc = mem_get_le32(raw_hdr + 8);
      input_ctx->width = mem_get_le16(raw_hdr + 12);
      input_ctx->height = mem_get_le16(raw_hdr + 14);
      input_ctx->framerate.numerator = mem_get_le32(raw_hdr + 16);
      input_ctx->framerate.denominator = mem_get_le32(raw_hdr + 20);
      fix_framerate(&input_ctx->framerate.numerator,
                    &input_ctx->framerate.denominator);
    }
  }

  if (!is_ivf) {
    rewind_detect(input_ctx);
  }
  return is_ivf;
}